

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O1

yyjson_mut_doc * duckdb_yyjson::yyjson_mut_doc_new(yyjson_alc *alc)

{
  _func_void_ptr_void_ptr_void_ptr_size_t_size_t *p_Var1;
  _func_void_void_ptr_void_ptr *p_Var2;
  void *pvVar3;
  yyjson_mut_doc *pyVar4;
  undefined **ppuVar5;
  
  ppuVar5 = &YYJSON_DEFAULT_ALC;
  if (alc != (yyjson_alc *)0x0) {
    ppuVar5 = &alc->malloc;
  }
  pyVar4 = (yyjson_mut_doc *)(*((yyjson_alc *)ppuVar5)->malloc)(((yyjson_alc *)ppuVar5)->ctx,0x78);
  if (pyVar4 == (yyjson_mut_doc *)0x0) {
    pyVar4 = (yyjson_mut_doc *)0x0;
  }
  else {
    (pyVar4->val_pool).chunk_size = 0;
    (pyVar4->val_pool).chunk_size_max = 0;
    (pyVar4->val_pool).cur = (yyjson_mut_val *)0x0;
    (pyVar4->val_pool).end = (yyjson_mut_val *)0x0;
    (pyVar4->str_pool).chunk_size_max = 0;
    (pyVar4->str_pool).chunks = (yyjson_str_chunk *)0x0;
    (pyVar4->str_pool).end = (char *)0x0;
    (pyVar4->str_pool).chunk_size = 0;
    (pyVar4->alc).ctx = (void *)0x0;
    (pyVar4->str_pool).cur = (char *)0x0;
    (pyVar4->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x0;
    (pyVar4->alc).free = (_func_void_void_ptr_void_ptr *)0x0;
    pyVar4->root = (yyjson_mut_val *)0x0;
    (pyVar4->alc).malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
    (pyVar4->val_pool).chunks = (yyjson_val_chunk *)0x0;
    p_Var1 = ((yyjson_alc *)ppuVar5)->realloc;
    p_Var2 = ((yyjson_alc *)ppuVar5)->free;
    pvVar3 = ((yyjson_alc *)ppuVar5)->ctx;
    (pyVar4->alc).malloc = ((yyjson_alc *)ppuVar5)->malloc;
    (pyVar4->alc).realloc = p_Var1;
    (pyVar4->alc).free = p_Var2;
    (pyVar4->alc).ctx = pvVar3;
    (pyVar4->str_pool).chunk_size = 0x100;
    (pyVar4->str_pool).chunk_size_max = 0x10000000;
    (pyVar4->val_pool).chunk_size = 0x180;
    (pyVar4->val_pool).chunk_size_max = 0x18000000;
  }
  return pyVar4;
}

Assistant:

yyjson_mut_doc *yyjson_mut_doc_new(const yyjson_alc *alc) {
    yyjson_mut_doc *doc;
    if (!alc) alc = &YYJSON_DEFAULT_ALC;
    doc = (yyjson_mut_doc *)alc->malloc(alc->ctx, sizeof(yyjson_mut_doc));
    if (!doc) return NULL;
    memset(doc, 0, sizeof(yyjson_mut_doc));

    doc->alc = *alc;
    doc->str_pool.chunk_size = YYJSON_MUT_DOC_STR_POOL_INIT_SIZE;
    doc->str_pool.chunk_size_max = YYJSON_MUT_DOC_STR_POOL_MAX_SIZE;
    doc->val_pool.chunk_size = YYJSON_MUT_DOC_VAL_POOL_INIT_SIZE;
    doc->val_pool.chunk_size_max = YYJSON_MUT_DOC_VAL_POOL_MAX_SIZE;
    return doc;
}